

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O1

void __thiscall
duckdb::CSVReaderOptions::SetWriteOption(CSVReaderOptions *this,string *loption,Value *value)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  BinderException *this_00;
  string *this_01;
  string format;
  vector<bool,_true> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  iVar3 = ::std::__cxx11::string::compare((char *)loption);
  if (iVar3 == 0) {
    ParseString((string *)&local_90,value,loption);
    this_01 = (string *)&this->write_newline;
  }
  else {
    bVar2 = SetBaseOption(this,loption,value,true);
    if (bVar2) {
      return;
    }
    iVar3 = ::std::__cxx11::string::compare((char *)loption);
    if (iVar3 == 0) {
      ParseColumnList(&local_90,value,&this->name_list,loption);
      ::std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
                ((_Bvector_base<std::allocator<bool>_> *)&this->force_quote);
      (this->force_quote).super_vector<bool,_std::allocator<bool>_>.
      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
           = local_90.super_vector<bool,_std::allocator<bool>_>.
             super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_end_of_storage;
      (this->force_quote).super_vector<bool,_std::allocator<bool>_>.
      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
      super__Bit_iterator_base._M_p =
           local_90.super_vector<bool,_std::allocator<bool>_>.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
           super__Bit_iterator_base._M_p;
      *(undefined8 *)
       ((long)&(this->force_quote).super_vector<bool,_std::allocator<bool>_>.
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
               .super__Bit_iterator_base + 8) =
           local_90.super_vector<bool,_std::allocator<bool>_>.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
           super__Bit_iterator_base._8_8_;
      (this->force_quote).super_vector<bool,_std::allocator<bool>_>.
      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p =
           local_90.super_vector<bool,_std::allocator<bool>_>.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
           super__Bit_iterator_base._M_p;
      *(undefined8 *)
       ((long)&(this->force_quote).super_vector<bool,_std::allocator<bool>_>.
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
               super__Bit_iterator_base + 8) =
           local_90.super_vector<bool,_std::allocator<bool>_>.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
           super__Bit_iterator_base._8_8_;
      return;
    }
    iVar3 = ::std::__cxx11::string::compare((char *)loption);
    if ((iVar3 == 0) || (iVar3 = ::std::__cxx11::string::compare((char *)loption), iVar3 == 0)) {
      ParseString((string *)&local_90,value,loption);
      SetDateFormat(this,DATE,(string *)&local_90,false);
      goto LAB_00bbfe3c;
    }
    iVar3 = ::std::__cxx11::string::compare((char *)loption);
    if ((iVar3 == 0) || (iVar3 = ::std::__cxx11::string::compare((char *)loption), iVar3 == 0)) {
      ParseString((string *)&local_90,value,loption);
      StringUtil::Lower(&local_48,(string *)&local_90);
      iVar3 = ::std::__cxx11::string::compare((char *)&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
      if (iVar3 == 0) {
        ::std::__cxx11::string::operator=((string *)&local_90,"%Y-%m-%dT%H:%M:%S.%fZ");
      }
      SetDateFormat(this,TIMESTAMP,(string *)&local_90,false);
      SetDateFormat(this,TIMESTAMP_TZ,(string *)&local_90,false);
      goto LAB_00bbfe3c;
    }
    iVar3 = ::std::__cxx11::string::compare((char *)loption);
    if (iVar3 == 0) {
      ParseString((string *)&local_90,value,loption);
      this_01 = (string *)&this->prefix;
    }
    else {
      iVar3 = ::std::__cxx11::string::compare((char *)loption);
      if (iVar3 != 0) {
        this_00 = (BinderException *)__cxa_allocate_exception(0x10);
        local_90.super_vector<bool,_std::allocator<bool>_>.
        super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
        super__Bit_iterator_base._M_p =
             (_Bit_type *)
             &local_90.super_vector<bool,_std::allocator<bool>_>.
              super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"Unrecognized option CSV writer \"%s\"","");
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        pcVar1 = (loption->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_68,pcVar1,pcVar1 + loption->_M_string_length);
        BinderException::BinderException<std::__cxx11::string>
                  (this_00,(string *)&local_90,&local_68);
        __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ParseString((string *)&local_90,value,loption);
      this_01 = (string *)&this->suffix;
    }
  }
  ::std::__cxx11::string::operator=(this_01,(string *)&local_90);
LAB_00bbfe3c:
  if ((_Bit_iterator *)
      local_90.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
      _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
      &local_90.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>
       ._M_impl.super__Bvector_impl_data._M_finish) {
    operator_delete(local_90.super_vector<bool,_std::allocator<bool>_>.
                    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                    _M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void CSVReaderOptions::SetWriteOption(const string &loption, const Value &value) {
	if (loption == "new_line") {
		// Steal this from SetBaseOption so we can write different newlines (e.g., format JSON ARRAY)
		write_newline = ParseString(value, loption);
		return;
	}

	if (SetBaseOption(loption, value, true)) {
		return;
	}

	if (loption == "force_quote") {
		force_quote = ParseColumnList(value, name_list, loption);
	} else if (loption == "date_format" || loption == "dateformat") {
		string format = ParseString(value, loption);
		SetDateFormat(LogicalTypeId::DATE, format, false);
	} else if (loption == "timestamp_format" || loption == "timestampformat") {
		string format = ParseString(value, loption);
		if (StringUtil::Lower(format) == "iso") {
			format = "%Y-%m-%dT%H:%M:%S.%fZ";
		}
		SetDateFormat(LogicalTypeId::TIMESTAMP, format, false);
		SetDateFormat(LogicalTypeId::TIMESTAMP_TZ, format, false);
	} else if (loption == "prefix") {
		prefix = ParseString(value, loption);
	} else if (loption == "suffix") {
		suffix = ParseString(value, loption);
	} else {
		throw BinderException("Unrecognized option CSV writer \"%s\"", loption);
	}
}